

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O2

pair<unsigned_long,_std::tuple<int>_> __thiscall
cppqc::detail::
doShrink<int,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
          (detail *this,
          Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
          *prop,Input *in,duration<double,_std::ratio<1L,_1L>_> timeout,ostream *out)

{
  _Head_base<0UL,_cppqc::detail::GenConcept<std::tuple<int>_>_*,_false> _Var1;
  bool bVar2;
  pointer ptVar3;
  bool bVar4;
  int iVar5;
  undefined8 extraout_RDX;
  pointer ptVar6;
  pair<unsigned_long,_std::tuple<int>_> pVar7;
  Input shrunk;
  Input input;
  vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> shrinks;
  anon_class_16_2_431eb4e8 isTimeoutReached;
  _Head_base<0UL,_int,_false> local_78;
  _Head_base<0UL,_int,_false> local_74;
  rep_conflict local_70;
  _Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_> local_68;
  detail *local_50;
  ostream *local_48;
  anon_class_16_2_431eb4e8 local_40;
  
  local_78._M_head_impl =
       (in->super__Tuple_impl<0UL,_int>).super__Head_base<0UL,_int,_false>._M_head_impl;
  local_70 = timeout.__r;
  local_50 = this;
  local_48 = out;
  local_40.start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_40.timeout.__r = local_70;
  local_70 = 0.0;
  do {
    _Var1._M_head_impl =
         (prop->m_gen).m_gen._M_t.
         super___uniq_ptr_impl<cppqc::detail::GenConcept<std::tuple<int>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<int>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::tuple<int>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::tuple<int>_>_>_>
         .super__Head_base<0UL,_cppqc::detail::GenConcept<std::tuple<int>_>_*,_false>._M_head_impl;
    (*(_Var1._M_head_impl)->_vptr_GenConcept[3])(&local_68,_Var1._M_head_impl,&local_78);
    ptVar3 = local_68._M_impl.super__Vector_impl_data._M_finish;
    for (ptVar6 = local_68._M_impl.super__Vector_impl_data._M_start; bVar2 = true, ptVar6 != ptVar3;
        ptVar6 = ptVar6 + 1) {
      local_74._M_head_impl =
           (ptVar6->super__Tuple_impl<0UL,_int>).super__Head_base<0UL,_int,_false>._M_head_impl;
      bVar4 = doShrink<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
              ::anon_class_16_2_431eb4e8::operator()(&local_40);
      if (bVar4) {
        std::operator<<(local_48,"Shrinking timed out...\n");
        break;
      }
      iVar5 = (*(prop->super_PropertyBase)._vptr_PropertyBase[6])(prop,&local_74);
      if ((char)iVar5 == '\0') {
        local_78._M_head_impl = local_74._M_head_impl;
        local_70 = (rep_conflict)((long)local_70 + 1);
        bVar2 = false;
        break;
      }
    }
    std::_Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>::~_Vector_base(&local_68);
    if (bVar2) {
      *(rep_conflict *)local_50 = local_70;
      *(int *)(local_50 + 8) = local_78._M_head_impl;
      pVar7._8_8_ = extraout_RDX;
      pVar7.first = (unsigned_long)local_50;
      return pVar7;
    }
  } while( true );
}

Assistant:

std::pair<std::size_t, typename Property<T0, T1, T2, T3, T4>::Input> doShrink(
    const Property<T0, T1, T2, T3, T4>& prop,
    const typename Property<T0, T1, T2, T3, T4>::Input& in,
    std::chrono::duration<double> timeout,
    std::ostream& out = std::cout) {
  using Input = typename Property<T0, T1, T2, T3, T4>::Input;

  std::size_t numShrinks = 0;
  Input shrunk = in;
  const auto start = std::chrono::steady_clock::now();

  auto isTimeoutReached = [start, timeout]() {
    const std::chrono::duration<double> elapsed =
        std::chrono::steady_clock::now() - start;
    return elapsed >= timeout;
  };

  try {
  continueShrinking:
    std::vector<Input> shrinks = prop.shrinkInput(shrunk);
    for (Input input : shrinks) {
      if (isTimeoutReached()) {
        out << "Shrinking timed out...\n";
        break;
      }

      if (!prop.checkInput(input)) {
        shrunk = std::move(input);
        numShrinks++;
        goto continueShrinking;
      }
    }
  } catch (...) {
  }
  return std::make_pair(numShrinks, shrunk);
}